

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arch_memory_mapping.c
# Opt level: O0

void walk_pml4e(MemoryMappingList *list,AddressSpace *as,hwaddr pml4e_start_addr,int32_t a20_mask,
               target_ulong start_line_addr)

{
  uint64_t uVar1;
  MemTxAttrs local_58;
  int local_54;
  int i;
  target_ulong line_addr;
  uint64_t pml4e;
  hwaddr pdpe_start_addr;
  hwaddr pml4e_addr;
  target_ulong start_line_addr_local;
  int32_t a20_mask_local;
  hwaddr pml4e_start_addr_local;
  AddressSpace *as_local;
  MemoryMappingList *list_local;
  
  for (local_54 = 0; local_54 < 0x200; local_54 = local_54 + 1) {
    local_58 = (MemTxAttrs)((uint)local_58 & 0xff800000 | 1);
    uVar1 = address_space_ldq_x86_64
                      ((uc_struct_conflict *)as->uc,as,
                       pml4e_start_addr + (long)(local_54 << 3) & (long)a20_mask,local_58,
                       (MemTxResult *)0x0);
    if ((uVar1 & 1) != 0) {
      walk_pdpe(list,as,uVar1 & 0xffffffffff000 & (long)a20_mask,a20_mask,
                start_line_addr | ((long)local_54 & 0x1ffU) << 0x27);
    }
  }
  return;
}

Assistant:

static void walk_pml4e(MemoryMappingList *list, AddressSpace *as,
                       hwaddr pml4e_start_addr, int32_t a20_mask,
                       target_ulong start_line_addr)
{
    hwaddr pml4e_addr, pdpe_start_addr;
    uint64_t pml4e;
    target_ulong line_addr;
    int i;

    for (i = 0; i < 512; i++) {
        pml4e_addr = (pml4e_start_addr + i * 8) & a20_mask;
#ifdef UNICORN_ARCH_POSTFIX
        pml4e = glue(address_space_ldq, UNICORN_ARCH_POSTFIX)(as->uc, as, pml4e_addr, MEMTXATTRS_UNSPECIFIED,
#else
        pml4e = address_space_ldq(as->uc, as, pml4e_addr, MEMTXATTRS_UNSPECIFIED,
#endif
                                  NULL);
        if (!(pml4e & PG_PRESENT_MASK)) {
            /* not present */
            continue;
        }

        line_addr = start_line_addr | ((i & 0x1ffULL) << 39);
        pdpe_start_addr = (pml4e & PLM4_ADDR_MASK) & a20_mask;
        walk_pdpe(list, as, pdpe_start_addr, a20_mask, line_addr);
    }
}